

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

void __thiscall curlpp::FormParts::File::File(File *this,string *name,string *filename)

{
  string *in_RDX;
  FormPart *in_RDI;
  string *in_stack_ffffffffffffffc8;
  
  FormPart::FormPart(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_FormPart = (_func_int **)&PTR__File_00162ba8;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  std::__cxx11::string::string((string *)&in_RDI[1].field_0x20);
  return;
}

Assistant:

curlpp::FormParts::File::File(const std::string & name, 
			      const std::string & filename)
  : FormPart(name)
  , mFilename(filename)
{}